

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
Shell::runCommand(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,WASTCommand *cmd)

{
  _Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  local_58;
  
  switch((cmd->
         super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
         ).
         super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
         .
         super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
         .
         super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
         .
         super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
         .
         super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::WATParser::Register,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
         ._M_index) {
  case '\0':
    addModule(__return_storage_ptr__,this,(WASTModule *)cmd);
    break;
  case '\x01':
    addRegistration(__return_storage_ptr__,this,(Register *)cmd);
    break;
  case '\x02':
    doAction((ActionResult *)&local_58,this,(Action *)cmd);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
    ::~_Variant_storage(&local_58);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    break;
  case '\x03':
    doAssertion(__return_storage_ptr__,this,(Assertion *)cmd);
    break;
  default:
    wasm::handle_unreachable
              ("unexpected command",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
               ,0x5a);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> runCommand(WASTCommand& cmd) {
    if (auto* mod = std::get_if<WASTModule>(&cmd)) {
      return addModule(*mod);
    } else if (auto* reg = std::get_if<Register>(&cmd)) {
      return addRegistration(*reg);
    } else if (auto* act = std::get_if<Action>(&cmd)) {
      doAction(*act);
      return Ok{};
    } else if (auto* assn = std::get_if<Assertion>(&cmd)) {
      return doAssertion(*assn);
    } else {
      WASM_UNREACHABLE("unexpected command");
    }
  }